

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::SolverParameter::MergeFrom(SolverParameter *this,SolverParameter *from)

{
  byte *pbVar1;
  uint32 *puVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  string *psVar6;
  string *psVar7;
  LogMessage *pLVar8;
  NetParameter *pNVar9;
  NetState *pNVar10;
  LogFinisher local_c9;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x2171);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  pvVar5 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->test_net_).super_RepeatedPtrFieldBase,
             &(from->test_net_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  iVar3 = (from->test_iter_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<int>::Reserve
              (&this->test_iter_,iVar3 + (this->test_iter_).current_size_);
    memcpy(((this->test_iter_).rep_)->elements + (this->test_iter_).current_size_,
           ((from->test_iter_).rep_)->elements,(long)(from->test_iter_).current_size_ << 2);
    (this->test_iter_).current_size_ =
         (this->test_iter_).current_size_ + (from->test_iter_).current_size_;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetParameter>::TypeHandler>
            (&(this->test_net_param_).super_RepeatedPtrFieldBase,
             &(from->test_net_param_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetState>::TypeHandler>
            (&(this->test_state_).super_RepeatedPtrFieldBase,
             &(from->test_state_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c8,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_c9,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
  }
  iVar3 = (from->stepvalue_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<int>::Reserve
              (&this->stepvalue_,iVar3 + (this->stepvalue_).current_size_);
    memcpy(((this->stepvalue_).rep_)->elements + (this->stepvalue_).current_size_,
           ((from->stepvalue_).rep_)->elements,(long)(from->stepvalue_).current_size_ << 2);
    (this->stepvalue_).current_size_ =
         (this->stepvalue_).current_size_ + (from->stepvalue_).current_size_;
  }
  uVar4 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar4 != '\0') {
    if ((uVar4 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      psVar6 = (from->train_net_).ptr_;
      psVar7 = (this->train_net_).ptr_;
      if (psVar7 != psVar6) {
        if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this->train_net_,psVar6);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar7);
        }
      }
    }
    if ((uVar4 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      psVar6 = (from->lr_policy_).ptr_;
      psVar7 = (this->lr_policy_).ptr_;
      if (psVar7 != psVar6) {
        if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this->lr_policy_,psVar6);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar7);
        }
      }
    }
    if ((uVar4 & 4) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      psVar6 = (from->snapshot_prefix_).ptr_;
      psVar7 = (this->snapshot_prefix_).ptr_;
      if (psVar7 != psVar6) {
        if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this->snapshot_prefix_,psVar6);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar7);
        }
      }
    }
    if ((uVar4 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      psVar6 = (from->net_).ptr_;
      psVar7 = (this->net_).ptr_;
      if (psVar7 != psVar6) {
        if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->net_,psVar6);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar7);
        }
      }
    }
    if ((uVar4 & 0x10) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      psVar6 = (from->regularization_type_).ptr_;
      psVar7 = (this->regularization_type_).ptr_;
      if (psVar7 != psVar6) {
        if (psVar7 == (string *)&_default_regularization_type__abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this->regularization_type_,psVar6);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar7);
        }
      }
    }
    if ((uVar4 & 0x20) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      psVar6 = (from->type_).ptr_;
      psVar7 = (this->type_).ptr_;
      if (psVar7 != psVar6) {
        if (psVar7 == (string *)&_default_type__abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->type_,psVar6);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar7);
        }
      }
    }
    if ((uVar4 & 0x40) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      if (this->train_net_param_ == (NetParameter *)0x0) {
        pNVar9 = (NetParameter *)operator_new(0xa0);
        NetParameter::NetParameter(pNVar9);
        this->train_net_param_ = pNVar9;
      }
      pNVar9 = from->train_net_param_;
      if (pNVar9 == (NetParameter *)0x0) {
        pNVar9 = (NetParameter *)&_NetParameter_default_instance_;
      }
      NetParameter::MergeFrom(this->train_net_param_,pNVar9);
    }
    if ((char)uVar4 < '\0') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      if (this->net_param_ == (NetParameter *)0x0) {
        pNVar9 = (NetParameter *)operator_new(0xa0);
        NetParameter::NetParameter(pNVar9);
        this->net_param_ = pNVar9;
      }
      pNVar9 = from->net_param_;
      if (pNVar9 == (NetParameter *)0x0) {
        pNVar9 = (NetParameter *)&_NetParameter_default_instance_;
      }
      NetParameter::MergeFrom(this->net_param_,pNVar9);
    }
  }
  if ((uVar4 & 0xff00) != 0) {
    if ((uVar4 >> 8 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 1;
      if (this->train_state_ == (NetState *)0x0) {
        pNVar10 = (NetState *)operator_new(0x38);
        NetState::NetState(pNVar10);
        this->train_state_ = pNVar10;
      }
      pNVar10 = from->train_state_;
      if (pNVar10 == (NetState *)0x0) {
        pNVar10 = (NetState *)&_NetState_default_instance_;
      }
      NetState::MergeFrom(this->train_state_,pNVar10);
    }
    if ((uVar4 >> 9 & 1) != 0) {
      this->test_interval_ = from->test_interval_;
    }
    if ((uVar4 >> 10 & 1) != 0) {
      this->base_lr_ = from->base_lr_;
    }
    if ((uVar4 >> 0xb & 1) != 0) {
      this->display_ = from->display_;
    }
    if ((uVar4 >> 0xc & 1) != 0) {
      this->max_iter_ = from->max_iter_;
    }
    if ((uVar4 >> 0xd & 1) != 0) {
      this->gamma_ = from->gamma_;
    }
    if ((uVar4 >> 0xe & 1) != 0) {
      this->power_ = from->power_;
    }
    if ((short)uVar4 < 0) {
      this->momentum_ = from->momentum_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
  }
  if ((uVar4 & 0xff0000) != 0) {
    if ((uVar4 >> 0x10 & 1) != 0) {
      this->weight_decay_ = from->weight_decay_;
    }
    if ((uVar4 >> 0x11 & 1) != 0) {
      this->stepsize_ = from->stepsize_;
    }
    if ((uVar4 >> 0x12 & 1) != 0) {
      this->snapshot_ = from->snapshot_;
    }
    if ((uVar4 >> 0x13 & 1) != 0) {
      this->device_id_ = from->device_id_;
    }
    if ((uVar4 >> 0x14 & 1) != 0) {
      this->test_compute_loss_ = from->test_compute_loss_;
    }
    if ((uVar4 >> 0x15 & 1) != 0) {
      this->snapshot_diff_ = from->snapshot_diff_;
    }
    if ((uVar4 >> 0x16 & 1) != 0) {
      this->debug_info_ = from->debug_info_;
    }
    if ((uVar4 >> 0x17 & 1) != 0) {
      this->solver_type_ = from->solver_type_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
  }
  if (0xffffff < uVar4) {
    if ((uVar4 >> 0x18 & 1) != 0) {
      this->momentum2_ = from->momentum2_;
    }
    if ((uVar4 >> 0x19 & 1) != 0) {
      this->random_seed_ = from->random_seed_;
    }
    if ((uVar4 >> 0x1a & 1) != 0) {
      this->solver_mode_ = from->solver_mode_;
    }
    if ((uVar4 >> 0x1b & 1) != 0) {
      this->test_initialization_ = from->test_initialization_;
    }
    if ((uVar4 >> 0x1c & 1) != 0) {
      this->snapshot_after_train_ = from->snapshot_after_train_;
    }
    if ((uVar4 >> 0x1d & 1) != 0) {
      this->delta_ = from->delta_;
    }
    if ((uVar4 >> 0x1e & 1) != 0) {
      this->average_loss_ = from->average_loss_;
    }
    if ((int)uVar4 < 0) {
      this->clip_gradients_ = from->clip_gradients_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
  }
  uVar4 = (from->_has_bits_).has_bits_[1];
  if ((uVar4 & 7) != 0) {
    if ((uVar4 & 1) != 0) {
      this->iter_size_ = from->iter_size_;
    }
    if ((uVar4 & 2) != 0) {
      this->snapshot_format_ = from->snapshot_format_;
    }
    if ((uVar4 & 4) != 0) {
      this->rms_decay_ = from->rms_decay_;
    }
    puVar2 = (this->_has_bits_).has_bits_ + 1;
    *puVar2 = *puVar2 | uVar4;
  }
  return;
}

Assistant:

void SolverParameter::MergeFrom(const SolverParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.SolverParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  test_net_.MergeFrom(from.test_net_);
  test_iter_.MergeFrom(from.test_iter_);
  test_net_param_.MergeFrom(from.test_net_param_);
  test_state_.MergeFrom(from.test_state_);
  stepvalue_.MergeFrom(from.stepvalue_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_train_net();
      train_net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.train_net_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_lr_policy();
      lr_policy_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.lr_policy_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_snapshot_prefix();
      snapshot_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.snapshot_prefix_);
    }
    if (cached_has_bits & 0x00000008u) {
      set_has_net();
      net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.net_);
    }
    if (cached_has_bits & 0x00000010u) {
      set_has_regularization_type();
      regularization_type_.AssignWithDefault(&SolverParameter::_default_regularization_type_.get(), from.regularization_type_);
    }
    if (cached_has_bits & 0x00000020u) {
      set_has_type();
      type_.AssignWithDefault(&SolverParameter::_default_type_.get(), from.type_);
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_train_net_param()->::caffe::NetParameter::MergeFrom(from.train_net_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_net_param()->::caffe::NetParameter::MergeFrom(from.net_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_train_state()->::caffe::NetState::MergeFrom(from.train_state());
    }
    if (cached_has_bits & 0x00000200u) {
      test_interval_ = from.test_interval_;
    }
    if (cached_has_bits & 0x00000400u) {
      base_lr_ = from.base_lr_;
    }
    if (cached_has_bits & 0x00000800u) {
      display_ = from.display_;
    }
    if (cached_has_bits & 0x00001000u) {
      max_iter_ = from.max_iter_;
    }
    if (cached_has_bits & 0x00002000u) {
      gamma_ = from.gamma_;
    }
    if (cached_has_bits & 0x00004000u) {
      power_ = from.power_;
    }
    if (cached_has_bits & 0x00008000u) {
      momentum_ = from.momentum_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 16711680u) {
    if (cached_has_bits & 0x00010000u) {
      weight_decay_ = from.weight_decay_;
    }
    if (cached_has_bits & 0x00020000u) {
      stepsize_ = from.stepsize_;
    }
    if (cached_has_bits & 0x00040000u) {
      snapshot_ = from.snapshot_;
    }
    if (cached_has_bits & 0x00080000u) {
      device_id_ = from.device_id_;
    }
    if (cached_has_bits & 0x00100000u) {
      test_compute_loss_ = from.test_compute_loss_;
    }
    if (cached_has_bits & 0x00200000u) {
      snapshot_diff_ = from.snapshot_diff_;
    }
    if (cached_has_bits & 0x00400000u) {
      debug_info_ = from.debug_info_;
    }
    if (cached_has_bits & 0x00800000u) {
      solver_type_ = from.solver_type_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 4278190080u) {
    if (cached_has_bits & 0x01000000u) {
      momentum2_ = from.momentum2_;
    }
    if (cached_has_bits & 0x02000000u) {
      random_seed_ = from.random_seed_;
    }
    if (cached_has_bits & 0x04000000u) {
      solver_mode_ = from.solver_mode_;
    }
    if (cached_has_bits & 0x08000000u) {
      test_initialization_ = from.test_initialization_;
    }
    if (cached_has_bits & 0x10000000u) {
      snapshot_after_train_ = from.snapshot_after_train_;
    }
    if (cached_has_bits & 0x20000000u) {
      delta_ = from.delta_;
    }
    if (cached_has_bits & 0x40000000u) {
      average_loss_ = from.average_loss_;
    }
    if (cached_has_bits & 0x80000000u) {
      clip_gradients_ = from.clip_gradients_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  cached_has_bits = from._has_bits_[1];
  if (cached_has_bits & 7u) {
    if (cached_has_bits & 0x00000001u) {
      iter_size_ = from.iter_size_;
    }
    if (cached_has_bits & 0x00000002u) {
      snapshot_format_ = from.snapshot_format_;
    }
    if (cached_has_bits & 0x00000004u) {
      rms_decay_ = from.rms_decay_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
}